

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O1

void __thiscall
GdlSubstitutionItem::DebugXmlLhs
          (GdlSubstitutionItem *this,GrcManager *param_1,ofstream *strmOut,string *param_3)

{
  ostream *poVar1;
  string local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)strmOut,"          <lhsSlot className=\"",0x1e);
  GrcSymbolTableEntry::FullAbbrev_abi_cxx11_
            (&local_38,(this->super_GdlSetAttrItem).super_GdlRuleItem.m_psymInput);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)strmOut,local_38._M_dataplus._M_p,local_38._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\" slotIndex=\"",0xd);
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(this->super_GdlSetAttrItem).super_GdlRuleItem.m_iritContextPos + 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\" />\n",5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void GdlSubstitutionItem::DebugXmlLhs(GrcManager * /*pcman*/, std::ofstream & strmOut,
	std::string /*staPathToCur*/)
{
	strmOut << "          <lhsSlot className=\"" << m_psymInput->FullAbbrev()
		<< "\" slotIndex=\"" << m_iritContextPos + 1 << "\" />\n";
}